

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

int get_option(int argc,char **argv)

{
  _Bool _Var1;
  byte extraout_AL;
  byte bVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *__dest;
  byte *__s;
  long lVar6;
  size_t unaff_R13;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char acStack_170 [272];
  char **ppcStack_60;
  byte *pbStack_58;
  size_t sStack_50;
  char *pcStack_48;
  code *pcStack_40;
  
  message[0] = '\0';
  uVar11 = 1;
  do {
    iVar9 = (int)uVar11;
    if (argc <= iVar9) {
      return 0;
    }
    __s = (byte *)argv[iVar9];
    if ((*__s | 2) == 0x2f) {
      bVar2 = __s[1];
      if (bVar2 == 0x66) {
        pcStack_40 = (code *)0x1014a5;
        sVar3 = strlen((char *)__s);
        if (sVar3 < 3) {
          uVar10 = iVar9 + 1;
          uVar11 = (ulong)uVar10;
          if (argc <= (int)uVar10) goto LAB_00101584;
          __s = (byte *)argv[(int)uVar10];
          __dest = infile;
        }
        else {
          __s = __s + 2;
LAB_001014af:
          __dest = infile;
        }
      }
      else if (bVar2 == 0x6f) {
        pcStack_40 = (code *)0x1014c0;
        sVar3 = strlen((char *)__s);
        if (sVar3 < 3) {
          uVar10 = iVar9 + 1;
          uVar11 = (ulong)uVar10;
          if (argc <= (int)uVar10) goto LAB_00101590;
          __s = (byte *)argv[(int)uVar10];
          __dest = outfile;
        }
        else {
          __s = __s + 2;
          __dest = outfile;
        }
      }
      else {
        if (bVar2 != 0x76) {
          if (bVar2 == 0x68) {
            pcStack_40 = (code *)0x10154c;
            usage_exit();
            goto LAB_0010154c;
          }
          goto LAB_00101558;
        }
        pcStack_40 = (code *)0x101426;
        sVar3 = strlen((char *)__s);
        if (sVar3 < 3) {
          uVar10 = iVar9 + 1;
          uVar11 = (ulong)uVar10;
          if (argc <= (int)uVar10) goto LAB_00101578;
          __s = (byte *)argv[(int)uVar10];
          __dest = voice;
        }
        else {
          __s = __s + 2;
          __dest = voice;
        }
      }
      pcStack_40 = (code *)0x1014d9;
      strcpy(__dest,(char *)__s);
    }
    else {
      pcStack_40 = (code *)0x101448;
      unaff_R13 = strlen(message);
      pcStack_40 = (code *)0x101453;
      sVar3 = strlen((char *)__s);
      if (((sVar3 + unaff_R13) - (ulong)(unaff_R13 == 0)) - 0x103 < 0xfffffffffffffefb) {
LAB_0010154c:
        pcStack_40 = (code *)0x101558;
        error_exit("too long string.");
        bVar2 = extraout_AL;
LAB_00101558:
        pcStack_40 = (code *)0x101573;
        fprintf(_stderr,"invalid option -- %c\n",(ulong)(uint)(int)(char)bVar2);
        pcStack_40 = (code *)0x101578;
        usage_exit();
LAB_00101578:
        pcStack_40 = (code *)0x101584;
        error_exit("option requires an argument -- v");
LAB_00101584:
        pcStack_40 = (code *)0x101590;
        error_exit("option requires an argument -- f");
LAB_00101590:
        pcStack_40 = print_voice_list;
        error_exit("option requires an argument -- o");
        pcStack_48 = message;
        ppcStack_60 = argv;
        pbStack_58 = __s;
        sStack_50 = unaff_R13;
        pcStack_40 = (code *)uVar11;
        puVar4 = (undefined8 *)openjtalk_getHTSVoiceList();
        puVar7 = (undefined8 *)0x0;
        puVar5 = puVar4;
        for (puVar8 = puVar4; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
          puVar5 = (undefined8 *)strlen((char *)puVar8[2]);
          if (puVar7 <= puVar5) {
            puVar7 = puVar5;
          }
        }
        for (; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
          sVar3 = strlen((char *)puVar4[2]);
          acStack_170[0] = ' ';
          acStack_170[1] = '\0';
          for (lVar6 = sVar3 + ((ulong)puVar7 & 0xfffffffffffffffc ^ 0xfffffffffffffffd); lVar6 != 0
              ; lVar6 = lVar6 + 1) {
            sVar3 = strlen(acStack_170);
            (acStack_170 + sVar3)[0] = ' ';
            (acStack_170 + sVar3)[1] = '\0';
          }
          uVar10 = printf("%s%s%s\n",puVar4[2],acStack_170,puVar4[1]);
          puVar5 = (undefined8 *)(ulong)uVar10;
        }
        return (int)puVar5;
      }
      pcStack_40 = (code *)0x101478;
      _Var1 = check_fullpath((char *)__s);
      if (_Var1) goto LAB_001014af;
      if (unaff_R13 != 0) {
        pcStack_40 = (code *)0x101489;
        sVar3 = strlen(message);
        (message + sVar3)[0] = ' ';
        (message + sVar3)[1] = '\0';
      }
      pcStack_40 = (code *)0x10149b;
      strcat(message,(char *)__s);
    }
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
}

Assistant:

int get_option(int argc, char *argv[])
{
	message[0] = '\0';
	for (int i = 1; i < argc; i++)
	{
		char *str = argv[i];
		if (str[0] == '-' || str[0] == '/')
		{
			switch (str[1])
			{
			case 'v':
				if (strlen(argv[i]) > 2)
				{
					strcpy(voice, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- v");
					}
					strcpy(voice, argv[++i]);
				}
				break;

			case 'o':
				if (strlen(argv[i]) > 2)
				{
					strcpy(outfile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- o");
					}
					strcpy(outfile, argv[++i]);
				}
				break;

			case 'f':
				if (strlen(argv[i]) > 2)
				{
					strcpy(infile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- f");
					}
					strcpy(infile, argv[++i]);
				}
				break;

			case 'h':
				usage_exit();
				break;

			default:
				fprintf(stderr, "invalid option -- %c\n", str[1]);
				usage_exit();
				break;
			}
		}
		else
		{
			size_t len = strlen(message);
			if (len + (len>0 ? 1 : 0) + strlen(str) + 1> MAX_PATH)
			{
				error_exit("too long string.");
			}
			if (check_fullpath(str))
			{
				strcpy(infile, str);
			}
			else
			{
				if (len > 0)
				{
					strcat(message, " ");
				}
				strcat(message, str);
			}
		}
	}
	return 0;
}